

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * __thiscall
nlohmann::json_abi_v3_11_2::detail::
lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::get_token_string(string *__return_storage_ptr__,
                  lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *this)

{
  byte *pbVar1;
  byte *pbVar2;
  array<char,_9UL> cs;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (byte *)(this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (pbVar2 = (byte *)(this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl
                        .super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    if (*pbVar2 < 0x20) {
      cs._M_elems[8] = '\0';
      cs._M_elems[0] = '\0';
      cs._M_elems[1] = '\0';
      cs._M_elems[2] = '\0';
      cs._M_elems[3] = '\0';
      cs._M_elems[4] = '\0';
      cs._M_elems[5] = '\0';
      cs._M_elems[6] = '\0';
      cs._M_elems[7] = '\0';
      snprintf(cs._M_elems,9,"<U+%.4X>");
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_token_string() const
    {
        // escape control characters
        std::string result;
        for (const auto c : token_string)
        {
            if (static_cast<unsigned char>(c) <= '\x1F')
            {
                // escape control characters
                std::array<char, 9> cs{{}};
                static_cast<void>((std::snprintf)(cs.data(), cs.size(), "<U+%.4X>", static_cast<unsigned char>(c))); // NOLINT(cppcoreguidelines-pro-type-vararg,hicpp-vararg)
                result += cs.data();
            }
            else
            {
                // add character as is
                result.push_back(static_cast<std::string::value_type>(c));
            }
        }

        return result;
    }